

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getTextures(Q3BSPFileParser *this)

{
  reference ppsVar1;
  sQ3BSPTexture *psVar2;
  value_type __dest;
  reference __src;
  reference ppsVar3;
  sQ3BSPTexture *pTexture;
  size_t idx;
  size_t Offset;
  Q3BSPFileParser *this_local;
  
  if (this->m_pModel != (Q3BSPModel *)0x0) {
    ppsVar1 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,1);
    idx = (size_t)(*ppsVar1)->iOffset;
    pTexture = (sQ3BSPTexture *)0x0;
    while( true ) {
      psVar2 = (sQ3BSPTexture *)
               std::
               vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
               ::size(&this->m_pModel->m_Textures);
      if (psVar2 <= pTexture) break;
      __dest = (value_type)operator_new(0x48);
      __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,idx);
      memcpy(__dest,__src,0x48);
      ppsVar3 = std::
                vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                ::operator[](&this->m_pModel->m_Textures,(size_type)pTexture);
      *ppsVar3 = __dest;
      idx = idx + 0x48;
      pTexture = (sQ3BSPTexture *)(pTexture->strName + 1);
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xe9,"void Assimp::Q3BSPFileParser::getTextures()");
}

Assistant:

void Q3BSPFileParser::getTextures()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[ kTextures ]->iOffset;
    for ( size_t idx=0; idx < m_pModel->m_Textures.size(); idx++ )
    {
        sQ3BSPTexture *pTexture = new sQ3BSPTexture;
        memcpy( pTexture, &m_Data[ Offset ], sizeof(sQ3BSPTexture) );
        m_pModel->m_Textures[ idx ] = pTexture;
        Offset += sizeof(sQ3BSPTexture);
    }
}